

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O3

string * __thiscall
upb::generator::ArchDependentSize_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,int64_t size32,int64_t size64)

{
  Nonnull<char_*> pcVar1;
  Nonnull<char_*> pcVar2;
  size_t in_R9;
  string_view format;
  char local_98 [32];
  long local_78;
  Nonnull<char_*> pcStack_70;
  long local_68;
  Nonnull<char_*> local_60;
  long local_58;
  Nonnull<char_*> local_50;
  char local_48 [32];
  
  if (this == (generator *)size32) {
    pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer((int64_t)this,local_98);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_98,pcVar1);
  }
  else {
    pcVar1 = absl::lts_20250127::numbers_internal::FastIntToBuffer((int64_t)this,local_98);
    pcVar2 = absl::lts_20250127::numbers_internal::FastIntToBuffer(size32,local_48);
    local_68 = (long)pcVar2 - (long)local_48;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    format._M_str = (char *)&local_78;
    format._M_len = (size_t)"UPB_SIZE($0, $1)";
    local_78 = (long)pcVar1 - (long)local_98;
    pcStack_70 = local_98;
    local_60 = local_48;
    local_58 = local_68;
    local_50 = local_48;
    absl::lts_20250127::substitute_internal::SubstituteAndAppendArray
              ((substitute_internal *)__return_storage_ptr__,(Nonnull<std::string_*>)0x10,format,
               (Nullable<const_absl::string_view_*>)0x2,in_R9);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ArchDependentSize(int64_t size32, int64_t size64) {
  if (size32 == size64) return absl::StrCat(size32);
  return absl::Substitute("UPB_SIZE($0, $1)", size32, size64);
}